

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

DescriptorScriptData *
cfd::ParseDescriptor
          (DescriptorScriptData *__return_storage_ptr__,string *descriptor,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list,
          NetType *net_type)

{
  pointer pKVar1;
  bool bVar2;
  pointer this;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> temp_key_list;
  AddressFactory addr_factory;
  string local_408;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_3e8;
  AddressFactory local_3d0;
  TaprootScriptTree *local_3a8;
  TapBranch *local_3a0;
  string *local_398;
  Script *local_390;
  Script *local_388;
  Address *local_380;
  Script *local_378;
  string *local_370;
  undefined1 local_368 [552];
  uint32_t local_140;
  TapBranch TStack_138;
  TaprootScriptTree TStack_c0;
  
  local_3e8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (KeyData *)0x0;
  local_3e8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (KeyData *)0x0;
  local_3e8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DescriptorScriptData::DescriptorScriptData(__return_storage_ptr__);
  if (net_type == (NetType *)0x0) {
    local_378 = &__return_storage_ptr__->locking_script;
    local_380 = &__return_storage_ptr__->address;
    local_388 = &__return_storage_ptr__->redeem_script;
    local_390 = (Script *)(local_368 + 0x1c8);
    local_398 = (string *)&__return_storage_ptr__->key;
    local_3a0 = &__return_storage_ptr__->branch;
    local_3a8 = &__return_storage_ptr__->tree;
    local_370 = descriptor;
    AddressFactory::AddressFactory(&local_3d0,kMainnet);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"");
    AddressFactory::ParseOutputDescriptor
              ((DescriptorScriptData *)local_368,&local_3d0,local_370,&local_408,
               (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0,
               (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0,
               &local_3e8);
    __return_storage_ptr__->type = local_368._0_4_;
    core::Script::operator=(local_378,(Script *)(local_368 + 8));
    __return_storage_ptr__->depth = local_368._64_4_;
    core::Address::operator=(local_380,(Address *)(local_368 + 0x48));
    __return_storage_ptr__->address_type = local_368._448_4_;
    core::Script::operator=(local_388,local_390);
    __return_storage_ptr__->key_type = local_368._512_4_;
    std::__cxx11::string::operator=(local_398,(string *)(local_368 + 0x208));
    __return_storage_ptr__->multisig_req_sig_num = local_140;
    core::TapBranch::operator=(local_3a0,&TStack_138);
    core::TaprootScriptTree::operator=(local_3a8,&TStack_c0);
    DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
  }
  else {
    AddressFactory::AddressFactory(&local_3d0,*net_type);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"");
    AddressFactory::ParseOutputDescriptor
              ((DescriptorScriptData *)local_368,&local_3d0,descriptor,&local_408,
               (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0,
               (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0,
               &local_3e8);
    __return_storage_ptr__->type = local_368._0_4_;
    core::Script::operator=(&__return_storage_ptr__->locking_script,(Script *)(local_368 + 8));
    __return_storage_ptr__->depth = local_368._64_4_;
    core::Address::operator=(&__return_storage_ptr__->address,(Address *)(local_368 + 0x48));
    __return_storage_ptr__->address_type = local_368._448_4_;
    core::Script::operator=(&__return_storage_ptr__->redeem_script,(Script *)(local_368 + 0x1c8));
    __return_storage_ptr__->key_type = local_368._512_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->key,(string *)(local_368 + 0x208));
    __return_storage_ptr__->multisig_req_sig_num = local_140;
    core::TapBranch::operator=(&__return_storage_ptr__->branch,&TStack_138);
    core::TaprootScriptTree::operator=(&__return_storage_ptr__->tree,&TStack_c0);
    DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
  }
  local_3d0._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_3d0.prefix_list_);
  pKVar1 = local_3e8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((key_list != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) &&
     (local_3e8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_3e8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    this = local_3e8.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
           _M_impl.super__Vector_impl_data._M_start;
    do {
      bVar2 = core::KeyData::IsValid(this);
      if (bVar2) {
        core::KeyData::GetFingerprint((ByteData *)local_368,this);
        bVar2 = core::ByteData::IsEmpty((ByteData *)local_368);
        if ((void *)CONCAT44(local_368._4_4_,local_368._0_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_368._4_4_,local_368._0_4_));
        }
        if (!bVar2) {
          std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                    (key_list,this);
        }
      }
      this = this + 1;
    } while (this != pKVar1);
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_3e8);
  return __return_storage_ptr__;
}

Assistant:

cfd::DescriptorScriptData ParseDescriptor(
    const std::string& descriptor, std::vector<KeyData>* key_list,
    NetType* net_type = nullptr) {
  std::vector<KeyData> temp_key_list;
  cfd::DescriptorScriptData script_data;
  if (net_type == nullptr) {
    NetType target_list[] = {
        NetType::kMainnet, NetType::kTestnet, NetType::kRegtest};
    size_t max = (sizeof(target_list) / sizeof(NetType)) - 1;
    for (size_t index = 0; index <= max; ++index) {
      try {
        cfd::AddressFactory addr_factory(target_list[index]);
        script_data = addr_factory.ParseOutputDescriptor(
            descriptor, "", nullptr, nullptr, &temp_key_list);
        break;
      } catch (const CfdException& except) {
        if (index == max) {
          throw except;
        }
      }
    }
  } else {
    cfd::AddressFactory addr_factory(*net_type);
    script_data = addr_factory.ParseOutputDescriptor(
        descriptor, "", nullptr, nullptr, &temp_key_list);
  }
  if (key_list != nullptr) {
    for (const auto& key : temp_key_list) {
      if (key.IsValid() && (!key.GetFingerprint().IsEmpty())) {
        key_list->push_back(key);
      }
    }
  }
  return script_data;
}